

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

int __thiscall
ON_TextureMapping::EvaluateBoxMapping
          (ON_TextureMapping *this,ON_3dPoint *P,ON_3dVector *N,ON_3dPoint *T)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  ulong uVar4;
  uint i;
  double dVar5;
  double dVar6;
  ON_3dPoint local_c8;
  ON_3dVector n;
  double local_88;
  double local_80;
  double local_78;
  undefined8 uStack_70;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  ON_Xform::operator*(&local_c8,&this->m_Pxyz,P);
  ON_Xform::operator*(&n,&this->m_Nxyz,N);
  ON_3dVector::Unitize(&n);
  local_88 = 0.0;
  if (this->m_projection == ray_projection) {
    iVar1 = 0;
    if (this->m_bCapped == true) {
      iVar1 = IntersectBoxRayHelper(&local_c8,&n,2,&local_88);
    }
    iVar2 = IntersectBoxRayHelper(&local_c8,&n,0,&local_80);
    if (((iVar1 == 0) || (local_88 < 0.0 && local_88 < local_80)) ||
       (local_78 = local_88, 0.0 <= local_80 && local_80 < local_88)) {
      local_78 = local_80;
      iVar1 = iVar2;
    }
    uStack_70 = 0;
    iVar2 = IntersectBoxRayHelper(&local_c8,&n,1,&local_80);
    if ((((iVar1 != 0) && (0.0 <= local_78 || local_80 <= local_78)) &&
        (dVar5 = local_78, local_80 < 0.0 || local_78 <= local_80)) ||
       (iVar1 = iVar2, dVar5 = local_80, iVar2 != 0)) {
      ::operator*(&local_48,dVar5,&n);
      ON_3dPoint::operator+(&local_60,&local_c8,&local_48);
      local_c8.z = local_60.z;
      local_c8.x = local_60.x;
      local_c8.y = local_60.y;
      goto LAB_004f2bcd;
    }
  }
  uVar4 = (ulong)(ABS(local_c8.x) < ABS(local_c8.y));
  if ((this->m_bCapped == true) &&
     (ABS((&local_c8.x)[ABS(local_c8.x) < ABS(local_c8.y)]) < ABS(local_c8.z))) {
    uVar4 = 2;
  }
  iVar1 = (int)uVar4 * 2 + 2;
  if ((&local_c8.x)[uVar4] <= 0.0 && (&local_c8.x)[uVar4] != 0.0) {
    iVar1 = (int)uVar4 * 2 + 1;
  }
  i = (uint)(ABS(n.x) < ABS(n.y));
  if ((this->m_bCapped != false) && (ABS((&n.x)[ABS(n.x) < ABS(n.y)]) < ABS(n.z))) {
    i = 2;
  }
  pdVar3 = ON_3dVector::operator[](&n,i);
  dVar5 = *pdVar3;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    if (0.0 <= dVar5) {
      if (0.0 < dVar5) {
        iVar1 = i * 2 + 2;
      }
    }
    else {
      iVar1 = i * 2 + 1;
    }
  }
LAB_004f2bcd:
  dVar5 = 0.0;
  switch(iVar1) {
  case 1:
    local_c8.x = -local_c8.y;
    local_c8.y = local_c8.z;
    dVar5 = 3.0;
    break;
  case 2:
    local_c8.x = local_c8.y;
    local_c8.y = local_c8.z;
    dVar5 = 1.0;
    break;
  case 3:
    local_c8.y = local_c8.z;
    break;
  case 4:
    local_c8.x = -local_c8.x;
    local_c8.y = local_c8.z;
    dVar5 = 2.0;
    break;
  case 5:
    local_c8.x = -local_c8.x;
    dVar5 = 4.0;
    break;
  case 6:
    dVar5 = 5.0;
  }
  local_c8.x = local_c8.x * 0.5 + 0.5;
  local_c8.y = local_c8.y * 0.5 + 0.5;
  local_c8.z = 0.0;
  if (this->m_texture_space == divided) {
    if (this->m_bCapped == false) {
      dVar6 = 4.0;
    }
    else {
      dVar6 = 6.0;
    }
    local_c8.x = (dVar5 + local_c8.x) / dVar6;
  }
  ON_Xform::operator*(&local_60,&this->m_uvw,&local_c8);
  T->z = local_60.z;
  T->x = local_60.x;
  T->y = local_60.y;
  return iVar1;
}

Assistant:

int ON_TextureMapping::EvaluateBoxMapping(
										   const ON_3dPoint& P,
										   const ON_3dVector& N,
										   ON_3dPoint* T
										   ) const
{
  // The matrix m_Pxyz transforms the world coordinate
  // "mapping cylinder" into the cylinder centered at
  // rst = (0,0,0) with radius 1.0.  The axis runs
  // from rst = (0,0,-1) to rst = (0,0,+1).

  ON_3dPoint rst(m_Pxyz*P);

	ON_3dVector n(m_Nxyz*N);
  n.Unitize();

	int side0, side1;
	double t0, t1;

	side0 = 0;
	t0 = 0.0;

  // side flag
  //  1 =  left side (x=-1)
  //  2 =  right side (x=+1)
  //  3 =  back side (y=-1)
  //  4 =  front side (y=+1)
  //  5 =  bottom side (z=-1)
  //  6 =  top side (z=+1)

  if ( ON_TextureMapping::PROJECTION::ray_projection == m_projection )
	{

		if ( m_bCapped )
		{
			// intersect ray with top and bottom
			side0 = IntersectBoxRayHelper(rst,n,2,&t0);
		}
		// intersect ray with front and back
		side1 = IntersectBoxRayHelper(rst,n,0,&t1);
		if ( 0 == side0 || 1 == BestHitHelper(t0,t1) )
		{
			side0 = side1;
			t0 = t1;
		}
		// intersect ray with left and right
		side1 = IntersectBoxRayHelper(rst,n,1,&t1);
		if ( 0 == side0 || 1 == BestHitHelper(t0,t1) )
		{
			side0 = side1;
			t0 = t1;
		}
		if ( 0 != side0 )
		{
			// ray hit the box
			rst = rst + t0*n;
		}
	}

  if ( 0 == side0 )
  {
    // set side0 = side closest to the point
    side1 = (fabs(rst.x) >= fabs(rst.y)) ? 0 : 1;
    if ( m_bCapped && fabs(rst.z) > fabs(((double*)&rst.x)[side1]) )
      side1 = 2;
    t1 = (&rst.x)[side1];
    if ( t1 < 0.0 )
    {
      side0 = 2*side1 + 1;
    }
    else
    {
      side0 = 2*side1 + 2;
    }

    //if ( fabs(t1) <= 1.0+ON_SQRT_EPSILON )...
    //// The point is inside the box.  If the normal
    //// is not zero, then use it to choose the side
    //// used for the closest point projection.

    side1 = ( fabs(n.x) >= fabs(n.y) ) ? 0 : 1;
    if ( m_bCapped && fabs(n.z) > fabs((&n.x)[side1]))
    {
      side1 = 2;
    }
    t1 = n[side1];
    if ( 0.0 != t1 )
    {
      if ( t1 < 0.0 )
        side0 = 2*side1 + 1;
      else if ( t1 > 0.0 )
        side0 = 2*side1 + 2;
    }
  }

	double shift = 0.0;

  // side flag
  //  1 =  left side (x=-1)
  //  2 =  right side (x=+1)
  //  3 =  back side (y=-1)
  //  4 =  front side (y=+1)
  //  5 =  bottom side (z=-1)
  //  6 =  top side (z=+1)

	switch(side0)
	{
	case 1: // x = -1
		rst.x = -rst.y;
		rst.y =  rst.z;
		shift =  3.0;
		break;
	case 2: // x = +1
		rst.x =  rst.y;
		rst.y =  rst.z;
		shift =  1.0;
		break;
	case 3: // y = -1
		rst.y =  rst.z;
		shift =  0.0;
		break;
	case 4: // y = +1
		rst.x = -rst.x;
		rst.y =  rst.z;
		shift =  2.0;
		break;
	case 5: // z = -1
		rst.x = -rst.x;
		shift =  4.0;
		break;
	case 6: // z = +1
		shift =  5.0;
		break;
	}

  // normalize texture coordinates
  rst.x = 0.5*rst.x + 0.5;
  rst.y = 0.5*rst.y + 0.5;
	rst.z = 0.0;

	if( ON_TextureMapping::TEXTURE_SPACE::divided == m_texture_space)
	{
    rst.x = (shift + rst.x)/(m_bCapped ? 6.0 : 4.0);
	}

	*T = m_uvw*rst;

  return side0;
}